

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseVar(WastParser *this,Var *out_var)

{
  Location loc;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  Literal *pLVar2;
  size_type sVar3;
  const_pointer pvVar4;
  undefined8 in_R9;
  string_view v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string asStack_1d8 [32];
  iterator local_1b8;
  size_type local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  string_view local_190;
  Var local_180;
  undefined1 local_138 [8];
  Token token_1;
  char local_78 [8];
  uint64_t index;
  string_view sv;
  Token token;
  Var *out_var_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Last_Literal,0);
  if (bVar1) {
    Consume((Token *)&sv._M_str,this);
    pLVar2 = Token::literal((Token *)&sv._M_str);
    index = (pLVar2->text)._M_len;
    sv._M_len = (size_t)(pLVar2->text)._M_str;
    local_78[0] = -1;
    local_78[1] = -1;
    local_78[2] = -1;
    local_78[3] = -1;
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    v._M_str = local_78;
    v._M_len = sv._M_len;
    result = ParseUint64((wabt *)index,v,(uint64_t *)index);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      loc.filename._M_str = (char *)token.loc.filename._M_len;
      loc.filename._M_len = (size_t)sv._M_str;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename._M_str;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid int \"%.*s\"",sVar3 & 0xffffffff,pvVar4,token.loc.filename._M_str,
            in_R9);
    }
    Var::Var((Var *)&token_1.field_2.literal_.text._M_str,local_78._0_4_,(Location *)&sv._M_str);
    Var::operator=(out_var,(Var *)&token_1.field_2.literal_.text._M_str);
    Var::~Var((Var *)&token_1.field_2.literal_.text._M_str);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    bVar1 = PeekMatch(this,Last_String,0);
    if (bVar1) {
      Consume((Token *)local_138,this);
      local_190 = Token::text((Token *)local_138);
      Var::Var(&local_180,local_190,(Location *)local_138);
      Var::operator=(out_var,&local_180);
      Var::~Var(&local_180);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"a numeric index",&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_1d8,"a name",&local_1fa);
      local_1b8 = &local_1f8;
      local_1b0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1fb);
      __l._M_len = local_1b0;
      __l._M_array = local_1b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1a8,__l,&local_1fb);
      this_local._4_4_ = ErrorExpected(this,&local_1a8,"12 or $foo");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1fb);
      local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8;
      do {
        local_218 = local_218 + -1;
        std::__cxx11::string::~string((string *)local_218);
      } while (local_218 != &local_1f8);
      std::allocator<char>::~allocator(&local_1fa);
      std::allocator<char>::~allocator(&local_1f9);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseVar(Var* out_var) {
  WABT_TRACE(ParseVar);
  if (PeekMatch(TokenType::Nat)) {
    Token token = Consume();
    std::string_view sv = token.literal().text;
    uint64_t index = kInvalidIndex;
    if (Failed(ParseUint64(sv, &index))) {
      // Print an error, but don't fail parsing.
      Error(token.loc, "invalid int \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    *out_var = Var(index, token.loc);
    return Result::Ok;
  } else if (PeekMatch(TokenType::Var)) {
    Token token = Consume();
    *out_var = Var(token.text(), token.loc);
    return Result::Ok;
  } else {
    return ErrorExpected({"a numeric index", "a name"}, "12 or $foo");
  }
}